

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O2

bool __thiscall AutoSystemInfo::CheckForAtom(AutoSystemInfo *this)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  
  piVar1 = (int *)cpuid_basic_info(0);
  if ((piVar1[3] == 0x6c65746e && (piVar1[2] == 0x49656e69 && piVar1[1] == 0x756e6547)) &&
      *piVar1 != 0) {
    puVar2 = (uint *)cpuid_Version_info(1);
    uVar3 = *puVar2 & 0xfff3ff0;
    if ((uVar3 - 0x30650 < 0x21) && ((0x100010001U >> ((ulong)(uVar3 - 0x30650) & 0x3f) & 1) != 0))
    {
      return true;
    }
    if (uVar3 == 0x106c0) {
      return true;
    }
    if (uVar3 == 0x20660) {
      return true;
    }
    if (uVar3 == 0x20670) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
AutoSystemInfo::CheckForAtom() const
{
    int CPUInfo[4];
    const int GENUINE_INTEL_0 = 0x756e6547,
              GENUINE_INTEL_1 = 0x49656e69,
              GENUINE_INTEL_2 = 0x6c65746e;
    const int PLATFORM_MASK = 0x0fff3ff0;
    const int ATOM_PLATFORM_A = 0x0106c0, /* bonnell - extended model 1c, type 0, family code 6 */
              ATOM_PLATFORM_B = 0x020660, /* lincroft - extended model 26, type 0, family code 6 */
              ATOM_PLATFORM_C = 0x020670, /* saltwell - extended model 27, type 0, family code 6 */
              ATOM_PLATFORM_D = 0x030650, /* tbd - extended model 35, type 0, family code 6 */
              ATOM_PLATFORM_E = 0x030660, /* tbd - extended model 36, type 0, family code 6 */
              ATOM_PLATFORM_F = 0x030670; /* tbd - extended model 37, type 0, family code 6 */
    int platformSignature;

    get_cpuid(CPUInfo, 0);

    // See if CPU is ATOM HW. First check if CPU is genuine Intel.
    if( CPUInfo[1]==GENUINE_INTEL_0 &&
        CPUInfo[3]==GENUINE_INTEL_1 &&
        CPUInfo[2]==GENUINE_INTEL_2)
    {
        get_cpuid(CPUInfo, 1);
        // get platform signature
        platformSignature = CPUInfo[0];
        if((( PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_A) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_B) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_C) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_D) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_E) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_F))
        {
            return true;
        }

    }
    return false;
}